

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::get_peer_info
          (torrent *this,
          vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *v)

{
  bool bVar1;
  reference pppVar2;
  reference pvVar3;
  peer_info *p;
  peer_connection *local_38;
  peer_connection *peer;
  peer_iterator __end2;
  peer_iterator __begin2;
  torrent *__range2;
  vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *v_local;
  torrent *this_local;
  
  ::std::vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>::clear(v)
  ;
  __end2 = begin(this);
  peer = (peer_connection *)end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                     *)&peer), bVar1) {
    pppVar2 = __gnu_cxx::
              __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
              ::operator*(&__end2);
    local_38 = *pppVar2;
    peer_connection::associated_torrent((peer_connection *)&p);
    bVar1 = ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::expired
                      ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&p);
    ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr((weak_ptr<libtorrent::aux::torrent> *)&p);
    if (!bVar1) {
      ::std::vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>::
      emplace_back<>(v);
      pvVar3 = ::std::
               vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>::
               back(v);
      (*(local_38->super_bandwidth_socket)._vptr_bandwidth_socket[0xd])(local_38,pvVar3);
    }
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void torrent::get_peer_info(std::vector<peer_info>* v)
	{
		v->clear();
		for (auto const* peer : *this)
		{
			TORRENT_ASSERT(peer->m_in_use == 1337);

			// incoming peers that haven't finished the handshake should
			// not be included in this list
			if (peer->associated_torrent().expired()) continue;

			v->emplace_back();
			peer_info& p = v->back();

			peer->get_peer_info(p);
		}
	}